

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_event_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
cbor_event_reader<std::__cxx11::istringstream&>
          (cbor_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          error_code *ec)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  cbor_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *in_RDI;
  cbor_decode_options *this_00;
  undefined1 local_38 [30];
  cbor_decode_options local_1a;
  
  this_00 = &local_1a;
  local_1a._2_8_ = in_RDX;
  local_1a._10_8_ = in_RSI;
  std::allocator<char>::allocator();
  cbor_decode_options::cbor_decode_options(this_00);
  cbor_event_reader<std::__cxx11::istringstream&>
            (in_RDI,this_00,local_1a._10_8_,local_38,local_1a._2_8_);
  cbor_decode_options::~cbor_decode_options(this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  return;
}

Assistant:

cbor_event_reader(Sourceable&& source, std::error_code& ec)
            : cbor_event_reader(std::allocator_arg, Allocator(),
                  std::forward<Sourceable>(source), 
                  cbor_decode_options(), 
                  ec)
        {
        }